

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

void DataBlobSourceCallback(DataBlob *blob,void *userData)

{
  hrgls_DataBlob blobToCopy;
  hrgls_DataBlob local_28;
  hrgls_DataBlob copy;
  hrgls_DataBlobSource info;
  void *userData_local;
  DataBlob *blob_local;
  
  if ((userData != (void *)0x0) && (*(long *)((long)userData + 8) != 0)) {
    copy = (hrgls_DataBlob)userData;
    info = (hrgls_DataBlobSource)userData;
    userData_local = blob;
    blobToCopy = hrgls::datablob::DataBlob::RawDataBlob(blob);
    hrgls_DataBlobCopy(&local_28,blobToCopy);
    (**(code **)&copy->size)(local_28,(copy->time).tv_sec);
  }
  return;
}

Assistant:

static void DataBlobSourceCallback(hrgls::datablob::DataBlob &blob, void *userData)
{
  // Get a pointer to the information we need to service the callback.
  if (!userData) { return; }
  hrgls_DataBlobSource info = static_cast<hrgls_DataBlobSource>(userData);

  if (info->CHandler) {
    // Make a copy of the blob to hand to the callback handler so that
    // they will destroy it just as they would one that is returned by
    // GetNextBlob().  This is extra work for this case, but it makes the
    // interface consistent between these two cases.
    hrgls_DataBlob copy;
    hrgls_DataBlobCopy(&copy, blob.RawDataBlob());
    info->CHandler(copy, info->CUserData);
  }
}